

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * aux_upvalue(StkId fi,int n,TValue **val)

{
  GCObject *pGVar1;
  global_State *pgVar2;
  Proto *p;
  Closure *f;
  TValue **val_local;
  int n_local;
  StkId fi_local;
  
  if (fi->tt == 6) {
    pGVar1 = (fi->value).gc;
    if ((pGVar1->h).flags == '\0') {
      pgVar2 = (pGVar1->th).l_G;
      if ((n < 1) || (*(int *)&pgVar2->weak < n)) {
        fi_local = (StkId)0x0;
      }
      else {
        *val = *(TValue **)(*(long *)((long)pGVar1 + (long)(n + -1) * 8 + 0x28) + 0x10);
        fi_local = (StkId)(*(long *)((long)pgVar2->gray + (long)(n + -1) * 8) + 0x18);
      }
    }
    else if ((n < 1) || ((int)(uint)(pGVar1->h).lsizenode < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = (TValue *)((long)pGVar1 + (long)(n + -1) * 0x10 + 0x28);
      fi_local = (StkId)0x12b0db;
    }
  }
  else {
    fi_local = (StkId)0x0;
  }
  return (char *)fi_local;
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val) {
  Closure *f;
  if (!ttisfunction(fi)) return NULL;
  f = clvalue(fi);
  if (f->c.isC) {
    if (!(1 <= n && n <= f->c.nupvalues)) return NULL;
    *val = &f->c.upvalue[n-1];
    return "";
  }
  else {
    Proto *p = f->l.p;
    if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
    *val = f->l.upvals[n-1]->v;
    return getstr(p->upvalues[n-1]);
  }
}